

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void ktx::validateToolInput(istream *stream,string *filepath,Reporter *report)

{
  int iVar1;
  int *piVar2;
  long *plVar3;
  undefined8 *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    plVar3 = (long *)std::_V2::generic_category();
    (**(code **)(*plVar3 + 0x20))(&local_68,plVar3,iVar1);
    Reporter::fatal<char_const(&)[35],std::__cxx11::string_const&,std::__cxx11::string>
              (report,IO_FAILURE,(char (*) [35])"Could not open input file \"{}\": {}",filepath,
               &local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/validate.cpp:320:21)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/validate.cpp:320:21)>
             ::_M_manager;
  iVar1 = validateIOStream(stream,filepath,false,false,
                           (function<void_(const_ktx::ValidationReport_&)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (iVar1 == 0) {
    std::istream::seekg(stream,0,0);
    if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      plVar3 = (long *)std::_V2::generic_category();
      (**(code **)(*plVar3 + 0x20))(&local_68,plVar3,iVar1);
      Reporter::fatal<char_const(&)[41],std::__cxx11::string_const&,std::__cxx11::string>
                (report,IO_FAILURE,(char (*) [41])"Could not rewind the input file \"{}\": {}",
                 filepath,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar4 = &PTR__exception_0025e588;
  *(int *)(puVar4 + 1) = iVar1;
  __cxa_throw(puVar4,&FatalError::typeinfo,std::exception::~exception);
}

Assistant:

void validateToolInput(std::istream& stream, const std::string& filepath, Reporter& report) {
    if (!stream)
        report.fatal(rc::IO_FAILURE, "Could not open input file \"{}\": {}", filepath, errnoMessage());

    auto callback = [&](const ValidationReport& issue) {
        fmt::print(std::cerr, "{}-{:04}: {}\n", toString(issue.type), issue.id, issue.message);
        fmt::print(std::cerr, "    {}\n", issue.details);
    };
    const auto validationResult = validateIOStream(stream, filepath, false, false, callback);

    if (validationResult != +rc::SUCCESS)
        throw FatalError(ReturnCode{validationResult});

    stream.seekg(0);
    if (!stream)
        report.fatal(rc::IO_FAILURE, "Could not rewind the input file \"{}\": {}", filepath, errnoMessage());
}